

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count128_lcg_shift.hpp
# Opt level: O3

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,count128_lcg_shift *R)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  long lVar3;
  status_type S_new;
  parameter_type P_new;
  delim_c local_74;
  delim_c local_73;
  delim_c local_72;
  delim_c local_71;
  delim_str local_70;
  status_type local_68;
  parameter_type local_58;
  
  local_58.a = 0;
  local_58.b = 0;
  local_58.increment.value._0_8_ = 0;
  local_58.increment.value._8_8_ = 0;
  local_68.r.value._0_8_ = 0;
  local_68.r.value._8_8_ = 0;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  utility::operator>>(in,(ignore_spaces_cl *)&local_70);
  local_71.c = '[';
  pbVar2 = utility::operator>>(in,&local_71);
  local_70.str = count128_lcg_shift::name();
  pbVar2 = utility::operator>>(pbVar2,&local_70);
  local_72.c = ' ';
  pbVar2 = utility::operator>>(pbVar2,&local_72);
  pbVar2 = operator>>(pbVar2,&local_58);
  local_73.c = ' ';
  pbVar2 = utility::operator>>(pbVar2,&local_73);
  pbVar2 = operator>>(pbVar2,&local_68);
  local_74.c = ']';
  utility::operator>>(pbVar2,&local_74);
  lVar3 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar3 + 0x20] & 5) == 0) {
    (R->P).a = local_58.a;
    (R->P).b = local_58.b;
    *(undefined8 *)&(R->P).increment.value = (undefined8)local_58.increment.value;
    *(undefined8 *)((long)&(R->P).increment.value + 8) = local_58.increment.value._8_8_;
    *(undefined8 *)&(R->S).r.value = (undefined8)local_68.r.value;
    *(undefined8 *)((long)&(R->S).r.value + 8) = local_68.r.value._8_8_;
    lVar3 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar3 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, count128_lcg_shift &R) {
      count128_lcg_shift::parameter_type P_new;
      count128_lcg_shift::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(count128_lcg_shift::name()) >>
          utility::delim(' ') >> P_new >> utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.P = P_new;
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }